

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O0

void ear::_assert_impl(bool condition,char *message)

{
  char *__s;
  internal_error *this;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *message_local;
  bool condition_local;
  
  if (!condition) {
    local_18 = message;
    message_local._7_1_ = condition;
    this = (internal_error *)__cxa_allocate_exception(0x10);
    __s = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
    internal_error::internal_error(this,&local_38);
    __cxa_throw(this,&internal_error::typeinfo,internal_error::~internal_error);
  }
  return;
}

Assistant:

inline void _assert_impl(bool condition, const char *message) {
    if (!condition) throw internal_error(message);
  }